

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.hh
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
MC::MC_Parser::value_type::as<std::__cxx11::string>(value_type *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  value_type *this_local;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Cjkkkk[P]minisql/build_O0/mc_parser.tab.hh"
                  ,0x13d,"T &MC::MC_Parser::value_type::as() [T = std::basic_string<char>]");
  }
  bVar1 = std::type_info::operator==(this->yytypeid_,(type_info *)&std::__cxx11::string::typeinfo);
  if (!bVar1) {
    __assert_fail("*yytypeid_ == typeid (T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Cjkkkk[P]minisql/build_O0/mc_parser.tab.hh"
                  ,0x13e,"T &MC::MC_Parser::value_type::as() [T = std::basic_string<char>]");
  }
  pbVar2 = yyas_<std::__cxx11::string>(this);
  return pbVar2;
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      YY_ASSERT (yytypeid_);
      YY_ASSERT (*yytypeid_ == typeid (T));
      YY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }